

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# min_max_operations.c
# Opt level: O3

int32_t WebRtcSpl_MinValueW32C(int32_t *vector,size_t length)

{
  int iVar1;
  size_t sVar2;
  
  if (length != 0) {
    iVar1 = 0x7fffffff;
    sVar2 = 0;
    do {
      if (vector[sVar2] < iVar1) {
        iVar1 = vector[sVar2];
      }
      sVar2 = sVar2 + 1;
    } while (length != sVar2);
    return iVar1;
  }
  __assert_fail("length > 0",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/signal_processing/min_max_operations.c"
                ,0x80,"int32_t WebRtcSpl_MinValueW32C(const int32_t *, size_t)");
}

Assistant:

int32_t WebRtcSpl_MinValueW32C(const int32_t* vector, size_t length) {
  int32_t minimum = WEBRTC_SPL_WORD32_MAX;
  size_t i = 0;

  assert(length > 0);

  for (i = 0; i < length; i++) {
    if (vector[i] < minimum)
      minimum = vector[i];
  }
  return minimum;
}